

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covec.cpp
# Opt level: O1

int main(int narg,char **argv)

{
  element_type *peVar1;
  undefined8 *puVar2;
  pointer ppVar3;
  undefined8 *puVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  pointer pbVar6;
  iterator __position;
  pointer pdVar7;
  pointer pcVar8;
  undefined8 uVar9;
  pointer puVar10;
  element_type *peVar11;
  element_type *peVar12;
  undefined1 auVar13 [16];
  double dVar14;
  pointer puVar15;
  pointer puVar16;
  pointer puVar17;
  element_type *peVar18;
  pointer psVar19;
  pointer pvVar20;
  pointer pvVar21;
  char cVar22;
  char cVar23;
  int iVar24;
  long lVar25;
  int *piVar26;
  long lVar27;
  istream *piVar28;
  ostream *poVar29;
  pointer psVar30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var31;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  _Var32;
  const_iterator cVar33;
  result_type_conflict1 rVar34;
  pointer pvVar35;
  ulong uVar36;
  long *plVar37;
  size_t __i;
  ulong uVar38;
  long *plVar39;
  pointer *ppsVar40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  long lVar41;
  uint uVar42;
  ulong uVar43;
  long lVar44;
  pointer psVar45;
  pointer ppVar46;
  ulong uVar47;
  pointer psVar48;
  size_t sVar49;
  ulong uVar50;
  unsigned_long uVar51;
  _Bit_pointer puVar52;
  ulong uVar53;
  Covec<float> *pCVar54;
  pointer pvVar55;
  __node_base_ptr *pp_Var56;
  ulong uVar57;
  pointer psVar58;
  pointer pbVar59;
  bool bVar60;
  undefined1 auVar61 [16];
  double dVar63;
  undefined1 auVar62 [16];
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>,_bool>
  pVar64;
  vector<bool,_std::allocator<bool>_> first_of_sharings;
  vector<unsigned_long,_std::allocator<unsigned_long>_> instance;
  vector<bool,_std::allocator<bool>_> first_of_sharings_1;
  vector<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
  codebooks;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  data;
  vector<unsigned_long,_std::allocator<unsigned_long>_> share;
  string line;
  string input_file;
  vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
  probs;
  size_t batch_size;
  string output_prefix;
  string share_str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  new_code2entries;
  Covec<float> cv;
  ifstream fin_1;
  mt19937 gen;
  size_t local_1908;
  undefined8 uStack_1900;
  long local_18f8;
  vector<bool,_std::allocator<bool>_> local_18e8;
  undefined1 local_18c0 [32];
  vector<bool,_std::allocator<bool>_> local_18a0;
  vector<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
  local_1878;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_1858;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1838;
  ulong local_1818;
  _func_void_Covec<float>_ptr___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_unsigned_long_mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_ptr
  *local_1810;
  long local_1808;
  undefined1 local_1800;
  undefined7 uStack_17ff;
  size_t local_17f0;
  pointer local_17e8;
  float local_17dc;
  float local_17d8;
  float local_17d4;
  size_t local_17d0;
  char *local_17c8;
  long local_17c0;
  char local_17b8 [16];
  vector<double,_std::allocator<double>_> local_17a8;
  reference_wrapper<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
  local_1790;
  __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  local_1788;
  size_t local_1780;
  undefined1 *local_1778;
  long local_1770;
  undefined1 local_1768 [16];
  char *local_1758;
  ulong local_1750;
  char local_1748 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1738;
  undefined1 local_1720 [32];
  size_t local_1700;
  size_t local_16f8;
  __node_base_ptr p_Stack_16f0;
  pointer local_16e8;
  vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
  local_16d0;
  vector<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
  local_16b8;
  vector<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  local_16a0;
  pointer local_1688;
  undefined1 local_1670 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1668;
  element_type local_1660 [4];
  ios_base local_1578 [272];
  Config local_1468;
  undefined1 local_13b8 [32];
  int aiStack_1398 [1240];
  size_t local_38;
  
  auVar61 = _local_1908;
  anon_unknown.dwarf_21e1e::parse_args(&local_1468,narg,argv);
  local_17d0 = local_1468.dim;
  local_1780 = local_1468.batch_size;
  local_17f0 = local_1468.neg_size;
  local_17d4 = local_1468.sigma;
  local_17d8 = local_1468.eta0;
  local_17dc = local_1468.eta1;
  local_17c8 = local_17b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_17c8,local_1468.input_file._M_dataplus._M_p,
             local_1468.input_file._M_dataplus._M_p + local_1468.input_file._M_string_length);
  local_1778 = local_1768;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1778,local_1468.output_prefix._M_dataplus._M_p,
             local_1468.output_prefix._M_dataplus._M_p + local_1468.output_prefix._M_string_length);
  local_1758 = local_1748;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1758,local_1468.share_str._M_dataplus._M_p,
             local_1468.share_str._M_dataplus._M_p + local_1468.share_str._M_string_length);
  local_1838.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_1838.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_1838.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  if (local_1750 != 0) {
    pp_Var56 = (__node_base_ptr *)0x0;
    do {
      lVar25 = std::__cxx11::string::find((char)&local_1758,0x2c);
      std::__cxx11::string::substr((ulong)local_13b8,(ulong)&local_1758);
      uVar9 = local_13b8._0_8_;
      piVar26 = __errno_location();
      iVar24 = *piVar26;
      *piVar26 = 0;
      lVar27 = strtol((char *)uVar9,(char **)local_1670,10);
      if (local_1670 == (undefined1  [8])uVar9) {
        std::__throw_invalid_argument("stoi");
LAB_0010d0ac:
        std::__throw_out_of_range("stoi");
        goto LAB_0010d0b8;
      }
      if (((int)lVar27 != lVar27) || (*piVar26 == 0x22)) goto LAB_0010d0ac;
      if (*piVar26 == 0) {
        *piVar26 = iVar24;
      }
      if ((element_type *)local_13b8._0_8_ != (element_type *)(local_13b8 + 0x10)) {
        operator_delete((void *)local_13b8._0_8_);
      }
      local_1720._0_8_ = SEXT48((int)lVar27);
      if (pp_Var56 < (ulong)local_1720._0_8_) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "invalid share string (share string should be 0, 1, 2, ... in this order): ",0x4a
                  );
        poVar29 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,local_1758,local_1750);
        std::endl<char,std::char_traits<char>>(poVar29);
        goto LAB_0010d00b;
      }
      pp_Var56 = (__node_base_ptr *)((long)pp_Var56 + (ulong)(pp_Var56 <= (ulong)local_1720._0_8_));
      if (local_1838.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_1838.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_1838,
                   (iterator)
                   local_1838.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)local_1720);
      }
      else {
        *local_1838.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = local_1720._0_8_;
        local_1838.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1838.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
    } while ((lVar25 != -1) && (lVar25 + 1U < local_1750));
  }
  std::ifstream::ifstream(local_13b8,(string *)&local_17c8,_S_in);
  if (*(int *)((long)aiStack_1398 +
              (long)(((element_type *)(local_13b8._0_8_ + -0x30))->_M_param)._M_cp.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start) == 0) {
    local_1668._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1660[0]._M_param._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)local_1660[0]._M_param._M_prob.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xffffffffffffff00);
    local_1670 = (undefined1  [8])local_1660;
    cVar23 = std::ios::widen((char)local_13b8 +
                             (char)(((element_type *)(local_13b8._0_8_ + -0x30))->_M_param)._M_cp.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start);
    piVar28 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)local_13b8,(string *)local_1670,cVar23);
    if (((byte)piVar28[*(long *)(*(long *)piVar28 + -0x18) + 0x20] & 5) == 0) {
      iVar24 = std::__cxx11::string::compare(local_1670);
      if (iVar24 != 0) {
        uVar42 = (uint)local_1468.sep;
        lVar25 = std::__cxx11::string::find((char)local_1670,(ulong)uVar42);
        uVar50 = 1;
        if (lVar25 != -1) {
          do {
            uVar50 = uVar50 + 1;
            lVar25 = std::__cxx11::string::find((char)local_1670,(ulong)uVar42);
          } while (lVar25 != -1);
        }
        if (local_1670 != (undefined1  [8])local_1660) {
          operator_delete((void *)local_1670);
        }
        std::ifstream::~ifstream(local_13b8);
        local_1908._0_1_ = local_1468.sort_enabled;
        auVar13 = _local_1908;
        uStack_1900 = auVar61._8_8_;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"config:",7);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"dim          : ",0xf);
        poVar29 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar29 + -0x18) + (char)poVar29);
        std::ostream::put((char)poVar29);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"batch_size   : ",0xf);
        poVar29 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar29 + -0x18) + (char)poVar29);
        std::ostream::put((char)poVar29);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"num_epochs   : ",0xf);
        poVar29 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar29 + -0x18) + (char)poVar29);
        std::ostream::put((char)poVar29);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"neg_size     : ",0xf);
        poVar29 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar29 + -0x18) + (char)poVar29);
        std::ostream::put((char)poVar29);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"num_threads  : ",0xf);
        poVar29 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar29 + -0x18) + (char)poVar29);
        std::ostream::put((char)poVar29);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"sigma        : ",0xf);
        poVar29 = std::ostream::_M_insert<double>((double)local_17d4);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar29 + -0x18) + (char)poVar29);
        std::ostream::put((char)poVar29);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"eta0         : ",0xf);
        poVar29 = std::ostream::_M_insert<double>((double)local_17d8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar29 + -0x18) + (char)poVar29);
        std::ostream::put((char)poVar29);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"eta1         : ",0xf);
        poVar29 = std::ostream::_M_insert<double>((double)local_17dc);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar29 + -0x18) + (char)poVar29);
        std::ostream::put((char)poVar29);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"input_file   : ",0xf);
        poVar29 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,local_17c8,local_17c0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar29 + -0x18) + (char)poVar29);
        std::ostream::put((char)poVar29);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"output_vector_file  : ",0x16);
        local_13b8._0_8_ = local_13b8 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_13b8,local_1778,local_1778 + local_1770);
        std::__cxx11::string::append(local_13b8);
        poVar29 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(char *)local_13b8._0_8_,local_13b8._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar29 + -0x18) + (char)poVar29);
        std::ostream::put((char)poVar29);
        std::ostream::flush();
        if ((undefined1 *)local_13b8._0_8_ != local_13b8 + 0x10) {
          operator_delete((void *)local_13b8._0_8_);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"sep          : ",0xf);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"",1);
        local_13b8[0] = local_1468.sep;
        poVar29 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,local_13b8,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar29,"\"",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar29 + -0x18) + (char)poVar29);
        std::ostream::put((char)poVar29);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"share        : ",0xf);
        if (local_1838.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_1838.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar47 = 0;
          do {
            if (uVar47 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",",1);
            }
            std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            uVar47 = uVar47 + 1;
          } while (uVar47 < (ulong)((long)local_1838.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_1838.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"order        : ",0xf);
        poVar29 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar29 + -0x18) + (char)poVar29);
        std::ostream::put((char)poVar29);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"shuffle      : ",0xf);
        *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18)
                 ) = *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash +
                              *(long *)(std::cout + -0x18)) | 1;
        poVar29 = std::ostream::_M_insert<bool>(true);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar29 + -0x18) + (char)poVar29);
        std::ostream::put((char)poVar29);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"sort         : ",0xf);
        *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18)
                 ) = *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash +
                              *(long *)(std::cout + -0x18)) | 1;
        poVar29 = std::ostream::_M_insert<bool>(true);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar29 + -0x18) + (char)poVar29);
        std::ostream::put((char)poVar29);
        std::ostream::flush();
        local_1878.
        super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1878.
        super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        uVar47 = 0;
        local_1878.
        super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1858.
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1858.
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1858.
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_13b8._0_8_ = (element_type *)0x0;
        lVar25 = 1;
        do {
          uVar47 = (ulong)(((uint)(uVar47 >> 0x1e) ^ (uint)uVar47) * 0x6c078965 + (int)lVar25);
          *(ulong *)(local_13b8 + lVar25 * 8) = uVar47;
          lVar25 = lVar25 + 1;
        } while (lVar25 != 0x270);
        local_38 = 0x270;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"load ",5);
        poVar29 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,local_17c8,local_17c0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar29," ...",4);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar29 + -0x18) + (char)poVar29);
        std::ostream::put((char)poVar29);
        std::ostream::flush();
        psVar19 = local_1878.
                  super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        psVar48 = local_1878.
                  super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar30 = local_1878.
                  super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (local_1878.
            super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_1878.
            super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          do {
            p_Var5 = (psVar30->
                     super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>
                     )._M_refcount._M_pi;
            if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
            }
            psVar30 = psVar30 + 1;
          } while (psVar30 != psVar19);
          local_1878.
          super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = psVar48;
        }
        psVar19 = local_1878.
                  super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        uVar47 = (long)local_1878.
                       super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)psVar48 >> 4;
        uVar57 = uVar50 - uVar47;
        if (uVar50 < uVar47 || uVar57 == 0) {
          psVar30 = local_1878.
                    super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (uVar50 < uVar47) {
            for (psVar58 = psVar48 + uVar50; psVar19 != psVar58; psVar58 = psVar58 + 1) {
              p_Var5 = (psVar58->
                       super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>
                       )._M_refcount._M_pi;
              if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
              }
              psVar30 = psVar48 + uVar50;
            }
          }
        }
        else if ((ulong)((long)local_1878.
                               super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage -
                         (long)local_1878.
                               super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish >> 4) < uVar57) {
          if ((uVar47 ^ 0x7ffffffffffffff) < uVar57) {
            std::__throw_length_error("vector::_M_default_append");
          }
          uVar38 = uVar57;
          if (uVar57 < uVar47) {
            uVar38 = uVar47;
          }
          uVar43 = uVar38 + uVar47;
          if (0x7fffffffffffffe < uVar43) {
            uVar43 = 0x7ffffffffffffff;
          }
          if (CARRY8(uVar38,uVar47)) {
            uVar43 = 0x7ffffffffffffff;
          }
          if (uVar43 == 0) {
            psVar30 = (pointer)0x0;
          }
          else {
            psVar30 = (pointer)operator_new(uVar43 << 4);
          }
          memset(psVar30 + uVar47,0,uVar57 * 0x10);
          if (psVar48 != psVar19) {
            lVar25 = 0;
            do {
              *(undefined8 *)
               ((long)&(psVar30->
                       super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>
                       )._M_refcount._M_pi + lVar25) = 0;
              puVar2 = (undefined8 *)
                       ((long)&(psVar48->
                               super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + lVar25);
              uVar9 = puVar2[1];
              puVar2[1] = 0;
              puVar4 = (undefined8 *)
                       ((long)&(psVar30->
                               super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + lVar25);
              *puVar4 = *puVar2;
              puVar4[1] = uVar9;
              *puVar2 = 0;
              lVar25 = lVar25 + 0x10;
            } while ((pointer)(puVar2 + 2) != psVar19);
          }
          if (psVar48 != (pointer)0x0) {
            operator_delete(psVar48);
          }
          local_1878.
          super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar30 + uVar43;
          local_1878.
          super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
          ._M_impl.super__Vector_impl_data._M_start = psVar30;
          psVar30 = psVar30 + uVar50;
        }
        else {
          memset(local_1878.
                 super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,0,uVar57 * 0x10);
          psVar30 = psVar19 + uVar57;
        }
        local_1878.
        super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = psVar30;
        local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._8_8_ =
             (ulong)(uint)local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ << 0x20;
        local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._8_8_ =
             (ulong)(uint)local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_ << 0x20
        ;
        local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
        if (uVar50 != 0) {
          uVar51 = 0;
          uVar47 = 0;
          do {
            if ((local_1838.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start ==
                 local_1838.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish) ||
               (local_1838.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_start[uVar47] == uVar51)) {
              std::vector<bool,_std::allocator<bool>_>::push_back(&local_18a0,true);
              uVar51 = uVar51 + 1;
            }
            else {
              std::vector<bool,_std::allocator<bool>_>::push_back(&local_18a0,false);
            }
            psVar48 = local_1878.
                      super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar47 = uVar47 + 1;
          } while (uVar50 != uVar47);
          this = &((local_1878.
                    super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount;
          uVar47 = 0;
          do {
            uVar57 = uVar47 + 0x3f;
            if (-1 < (long)uVar47) {
              uVar57 = uVar47;
            }
            if ((*(ulong *)((long)local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           (((long)uVar57 >> 6) +
                           ((ulong)((uVar47 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8)
                 >> (uVar47 & 0x3f) & 1) == 0) {
              uVar51 = local_1838.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar47];
              ((__shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2> *)
              (this + -1))->_M_ptr =
                   psVar48[uVar51].
                   super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        (this,&psVar48[uVar51].
                               super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount);
            }
            else {
              p_Var31 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x78);
              p_Var31->_M_use_count = 1;
              p_Var31->_M_weak_count = 1;
              p_Var31->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0011ab80
              ;
              p_Var31[4]._vptr__Sp_counted_base = (_func_int **)0x0;
              p_Var31[4]._M_use_count = 0;
              p_Var31[4]._M_weak_count = 0;
              p_Var31[6]._vptr__Sp_counted_base = (_func_int **)0x0;
              p_Var31[6]._M_use_count = 0;
              p_Var31[6]._M_weak_count = 0;
              p_Var31[1]._vptr__Sp_counted_base = (_func_int **)0x0;
              p_Var31[1]._M_use_count = 0;
              p_Var31[1]._M_weak_count = 0;
              p_Var31[2]._vptr__Sp_counted_base = (_func_int **)0x0;
              p_Var31[2]._M_use_count = 0;
              p_Var31[2]._M_weak_count = 0;
              p_Var31[3]._vptr__Sp_counted_base = (_func_int **)0x0;
              p_Var31[3]._M_use_count = 0;
              p_Var31[3]._M_weak_count = 0;
              p_Var31[7]._vptr__Sp_counted_base = (_func_int **)0x0;
              p_Var31[4]._vptr__Sp_counted_base = (_func_int **)(p_Var31 + 7);
              p_Var31[4]._M_use_count = 1;
              p_Var31[4]._M_weak_count = 0;
              p_Var31[5]._vptr__Sp_counted_base = (_func_int **)0x0;
              p_Var31[5]._M_use_count = 0;
              p_Var31[5]._M_weak_count = 0;
              *(undefined4 *)&p_Var31[6]._vptr__Sp_counted_base = 0x3f800000;
              p_Var31[6]._M_use_count = 0;
              p_Var31[6]._M_weak_count = 0;
              p_Var31[7]._vptr__Sp_counted_base = (_func_int **)0x0;
              ((__shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2> *)
              (this + -1))->_M_ptr = (element_type *)(p_Var31 + 1);
              p_Var5 = this->_M_pi;
              this->_M_pi = p_Var31;
              if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
              }
            }
            uVar47 = uVar47 + 1;
            this = this + 2;
          } while (uVar50 != uVar47);
        }
        std::ifstream::ifstream(local_1670,local_17c8,_S_in);
        if (*(int *)((long)&local_1660[0]._M_param._M_prob.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data +
                    (long)((((element_type *)((long)local_1670 + -0x30))->_M_param)._M_cp.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + 2)) == 0) {
          local_1810 = (_func_void_Covec<float>_ptr___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_unsigned_long_mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_ptr
                        *)&local_1800;
          local_1808 = 0;
          local_1800 = (_func_void_Covec<float>_ptr___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_unsigned_long_mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_ptr
                        )0x0;
          local_17e8 = local_1878.
                       super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          local_1818 = 0;
          while( true ) {
            cVar23 = std::ios::widen((char)(((element_type *)((long)local_1670 + -0x30))->_M_param).
                                           _M_cp.super__Vector_base<double,_std::allocator<double>_>
                                           ._M_impl.super__Vector_impl_data._M_start +
                                     (char)(istream *)local_1670);
            piVar28 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)local_1670,(string *)&local_1810,cVar23);
            if (((byte)piVar28[*(long *)(*(long *)piVar28 + -0x18) + 0x20] & 5) != 0) break;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_18c0,uVar50,
                       (allocator_type *)local_1720);
            local_1818 = local_1818 + 1;
            uVar47 = 1;
            psVar48 = local_17e8;
            do {
              lVar25 = std::__cxx11::string::find((char)&local_1810,(ulong)uVar42);
              peVar12 = (psVar48->
                        super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr;
              std::__cxx11::string::substr((ulong)&local_18e8,(ulong)&local_1810);
              _Var32._M_cur =
                   (__node_type *)
                   std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&(peVar12->entry2codes_)._M_h,(key_type *)&local_18e8);
              if (_Var32._M_cur == (__node_type *)0x0) {
                pbVar59 = (peVar12->code2entries_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pbVar6 = (peVar12->code2entries_).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                local_1720._0_8_ = local_1720 + 0x10;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_1720,
                           local_18e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                           (pointer)((long)local_18e8.super__Bvector_base<std::allocator<bool>_>.
                                           _M_impl.super__Bvector_impl_data._M_start.
                                           super__Bit_iterator_base._M_p +
                                    CONCAT44(local_18e8.super__Bvector_base<std::allocator<bool>_>.
                                             _M_impl.super__Bvector_impl_data._M_start.
                                             super__Bit_iterator_base._12_4_,
                                             local_18e8.super__Bvector_base<std::allocator<bool>_>.
                                             _M_impl.super__Bvector_impl_data._M_start.
                                             super__Bit_iterator_base._M_offset)));
                local_1700 = (long)pbVar6 - (long)pbVar59 >> 5;
                pVar64 = std::
                         _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                         ::_M_emplace<std::pair<std::__cxx11::string,unsigned_long>>
                                   ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                                     *)&peVar12->entry2codes_,local_1720);
                _Var32._M_cur =
                     (__node_type *)
                     pVar64.first.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                     ._M_cur;
                if ((undefined1 *)local_1720._0_8_ != local_1720 + 0x10) {
                  operator_delete((void *)local_1720._0_8_);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&peVar12->code2entries_,(value_type *)&local_18e8);
                local_1720._0_8_ = (__node_base_ptr *)0x0;
                __position._M_current =
                     (peVar12->counts_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (peVar12->counts_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                            (&peVar12->counts_,__position,(double *)local_1720);
                }
                else {
                  *__position._M_current = 0.0;
                  (peVar12->counts_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish = __position._M_current + 1;
                }
              }
              lVar27 = *(long *)((long)&((_Var32._M_cur)->
                                        super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                        ).
                                        super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                                        ._M_storage._M_storage + 0x20);
              pdVar7 = (peVar12->counts_).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              pdVar7[lVar27] = pdVar7[lVar27] + 1.0;
              if ((_Bit_iterator *)
                  local_18e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                  &local_18e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish) {
                operator_delete(local_18e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
              }
              *(long *)(local_18c0._0_8_ + uVar47 * 8 + -8) = lVar27;
              if (uVar50 < uVar47) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"too many entries in a line: ",0x1c);
                poVar29 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,(char *)local_1810,local_1808);
                std::endl<char,std::char_traits<char>>(poVar29);
                goto LAB_0010d00b;
              }
              lVar25 = lVar25 + 1;
              if (lVar25 == 0) {
                lVar25 = -1;
              }
              uVar47 = uVar47 + 1;
              psVar48 = psVar48 + 1;
            } while (lVar25 != -1);
            if (local_1468.sort_enabled == false) {
              std::
              vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::push_back(&local_1858,(value_type *)local_18c0);
            }
            if ((Covec<float> *)local_18c0._0_8_ != (Covec<float> *)0x0) {
              operator_delete((void *)local_18c0._0_8_);
            }
          }
          if (local_1468.sort_enabled != false) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"reindex ...",0xb);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
            std::ostream::put(-0x70);
            std::ostream::flush();
            if (uVar50 != 0) {
              local_17e8 = local_1878.
                           super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              uVar47 = 0;
              local_1908 = 0x800000000000003f;
              do {
                uVar57 = uVar47 + 0x3f;
                if (-1 < (long)uVar47) {
                  uVar57 = uVar47;
                }
                if ((*(ulong *)((long)local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                      _M_p +
                               (((long)uVar57 >> 6) +
                               ((ulong)((uVar47 & 0x800000000000003f) < 0x8000000000000001) - 1)) *
                               8) >> (uVar47 & 0x3f) & 1) != 0) {
                  peVar12 = local_17e8[uVar47].
                            super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr;
                  std::
                  vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                  ::vector((vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                            *)local_18c0,
                           (long)(peVar12->counts_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)(peVar12->counts_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 3,(allocator_type *)local_1720)
                  ;
                  std::vector<double,_std::allocator<double>_>::vector
                            (&local_17a8,
                             (long)(peVar12->counts_).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)(peVar12->counts_).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 3,
                             (allocator_type *)local_1720);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_1738,
                           (long)(peVar12->counts_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)(peVar12->counts_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 3,(allocator_type *)local_1720)
                  ;
                  uVar9 = local_18c0._0_8_;
                  local_1720._0_8_ = &p_Stack_16f0;
                  local_1720._8_8_ = (pointer)0x1;
                  local_1720._16_8_ = (_Hash_node_base *)0x0;
                  local_1720._24_8_ = 0;
                  local_1700 = CONCAT44(local_1700._4_4_,0x3f800000);
                  local_16f8 = 0;
                  p_Stack_16f0 = (__node_base_ptr)0x0;
                  pdVar7 = (peVar12->counts_).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar25 = (long)(peVar12->counts_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pdVar7;
                  if (lVar25 != 0) {
                    lVar25 = lVar25 >> 3;
                    ppsVar40 = &(((vector<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                                   *)local_18c0._0_8_)->
                                super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish;
                    psVar45 = (pointer)0x0;
                    do {
                      ((_Vector_impl_data *)(ppsVar40 + -1))->_M_start =
                           (pointer)pdVar7[(long)psVar45];
                      *ppsVar40 = psVar45;
                      psVar45 = (pointer)((long)&(psVar45->
                                                 super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>
                                                 )._M_ptr + 1);
                      ppsVar40 = ppsVar40 + 2;
                    } while ((pointer)(lVar25 + (ulong)(lVar25 == 0)) != psVar45);
                  }
                  pCVar54 = (Covec<float> *)CONCAT44(local_18c0._12_4_,local_18c0._8_4_);
                  if ((Covec<float> *)local_18c0._0_8_ != pCVar54) {
                    uVar57 = (long)pCVar54 - local_18c0._0_8_ >> 4;
                    lVar25 = 0x3f;
                    if (uVar57 != 0) {
                      for (; uVar57 >> lVar25 == 0; lVar25 = lVar25 + -1) {
                      }
                    }
                    std::
                    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,unsigned_long>*,std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<std::pair<double,unsigned_long>>>>
                              (local_18c0._0_8_,pCVar54,((uint)lVar25 ^ 0x3f) * 2 ^ 0x7e);
                    std::
                    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,unsigned_long>*,std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<std::pair<double,unsigned_long>>>>
                              (uVar9,pCVar54);
                  }
                  lVar25 = CONCAT44(local_18c0._12_4_,local_18c0._8_4_) - local_18c0._0_8_;
                  if (lVar25 != 0) {
                    lVar25 = lVar25 >> 4;
                    lVar27 = 8;
                    lVar44 = 0;
                    puVar52 = (_Bit_pointer)0x0;
                    do {
                      pbVar59 = (peVar12->code2entries_).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start +
                                *(long *)((long)&(((
                                                  vector<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                                                  *)local_18c0._0_8_)->
                                                 super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start + lVar27
                                         );
                      local_17a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)puVar52] =
                           *(double *)(local_18c0._0_8_ + lVar27 + -8);
                      std::__cxx11::string::_M_assign
                                ((string *)
                                 ((long)&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            *)&(local_1738.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                               _M_dataplus)->_M_impl).super__Vector_impl_data.
                                         _M_start + lVar44));
                      local_18e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                           (_Bit_type *)
                           &local_18e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish;
                      pcVar8 = (pbVar59->_M_dataplus)._M_p;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_18e8,pcVar8,pcVar8 + pbVar59->_M_string_length);
                      local_18e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage = puVar52;
                      std::
                      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      ::_M_emplace<std::pair<std::__cxx11::string,unsigned_long>>
                                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                                  *)local_1720,(string *)&local_18e8);
                      if ((_Bit_iterator *)
                          local_18e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                          &local_18e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish) {
                        operator_delete(local_18e8.super__Bvector_base<std::allocator<bool>_>.
                                        _M_impl.super__Bvector_impl_data._M_start.
                                        super__Bit_iterator_base._M_p);
                      }
                      puVar52 = (_Bit_pointer)((long)puVar52 + 1);
                      lVar44 = lVar44 + 0x20;
                      lVar27 = lVar27 + 0x10;
                    } while ((_Bit_pointer)(lVar25 + (ulong)(lVar25 == 0)) != puVar52);
                  }
                  std::vector<double,_std::allocator<double>_>::operator=
                            (&peVar12->counts_,&local_17a8);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator=(&peVar12->code2entries_,&local_1738);
                  if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_1720 != &(peVar12->entry2codes_)._M_h) {
                    std::
                    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    ::
                    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                                *)&peVar12->entry2codes_,
                               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                *)local_1720);
                  }
                  std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)local_1720);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_1738);
                  if (local_17a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_17a8.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                  if ((Covec<float> *)local_18c0._0_8_ != (Covec<float> *)0x0) {
                    operator_delete((void *)local_18c0._0_8_);
                  }
                }
                uVar47 = uVar47 + 1;
                auVar13 = _local_1908;
              } while (uVar47 != uVar50);
            }
            _local_1908 = auVar13;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"remake data ...",0xf);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
            std::ostream::put(-0x70);
            std::ostream::flush();
            lVar25 = ((long)local_1858.
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_1858.
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
            std::
            vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::resize(&local_1858,local_1818 + lVar25);
            std::ios::clear((int)local_1670 +
                            (int)(((element_type *)((long)local_1670 + -0x30))->_M_param)._M_cp.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start);
            std::istream::seekg((long)local_1670,_S_beg);
            psVar48 = local_1878.
                      super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            while( true ) {
              cVar23 = std::ios::widen((char)(((element_type *)((long)local_1670 + -0x30))->_M_param
                                             )._M_cp.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start +
                                       (char)(istream *)local_1670);
              piVar28 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                  ((istream *)local_1670,(string *)&local_1810,cVar23);
              if (((byte)piVar28[*(long *)(*(long *)piVar28 + -0x18) + 0x20] & 5) != 0) break;
              local_1908 = lVar25;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_18e8,uVar50
                         ,(allocator_type *)local_1720);
              lVar27 = 0;
              do {
                lVar41 = std::__cxx11::string::find((char)(string *)&local_1810,(ulong)uVar42);
                lVar44 = *(long *)((long)&(psVar48->
                                          super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr + lVar27 * 2);
                std::__cxx11::string::substr((ulong)local_1720,(ulong)&local_1810);
                cVar33 = std::
                         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)(lVar44 + 0x30),(key_type *)local_1720);
                if (cVar33.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                    ._M_cur == (__node_type *)0x0) {
                  std::__throw_out_of_range("_Map_base::at");
                  goto LAB_0010d021;
                }
                uVar9 = *(undefined8 *)
                         ((long)cVar33.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                ._M_cur + 0x28);
                if ((undefined1 *)local_1720._0_8_ != local_1720 + 0x10) {
                  operator_delete((void *)local_1720._0_8_);
                }
                lVar41 = lVar41 + 1;
                if (lVar41 == 0) {
                  lVar41 = -1;
                }
                *(undefined8 *)
                 ((long)local_18e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar27) =
                     uVar9;
                lVar27 = lVar27 + 8;
              } while (lVar41 != -1);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                        (local_1858.
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar25,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_18e8);
              if ((_Bit_iterator *)
                  local_18e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                  (_Bit_iterator *)0x0) {
                operator_delete(local_18e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
              }
              lVar25 = lVar25 + 1;
            }
          }
          if (local_1810 !=
              (_func_void_Covec<float>_ptr___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_unsigned_long_mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_ptr
               *)&local_1800) {
            operator_delete(local_1810);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"cannot open file: ",0x12);
          poVar29 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,local_17c8,local_17c0);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar29 + -0x18) + (char)poVar29);
          std::ostream::put((char)poVar29);
          std::ostream::flush();
        }
        std::ifstream::~ifstream(local_1670);
        if ((_Bit_iterator *)
            local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p != (_Bit_iterator *)0x0) {
          operator_delete(local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
          local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._8_8_ =
               local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000
          ;
          local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._8_8_ =
               local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ &
               0xffffffff00000000;
          local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage = (_Bit_pointer)0x0;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"data size: ",0xb);
        poVar29 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar29 + -0x18) + (char)poVar29);
        std::ostream::put((char)poVar29);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"codebook sizes:",0xf);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
        if (uVar50 != 0) {
          uVar47 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
            poVar29 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar29,": ",2);
            poVar29 = std::ostream::_M_insert<unsigned_long>((ulong)poVar29);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar29 + -0x18) + (char)poVar29);
            std::ostream::put((char)poVar29);
            std::ostream::flush();
            uVar47 = uVar47 + 1;
          } while (uVar50 != uVar47);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"creat distributions ...",0x17);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
        psVar19 = local_1878.
                  super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        psVar48 = local_1878.
                  super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar25 = (long)local_1878.
                       super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_1878.
                       super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4;
        local_17a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_17a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_17a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_18e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_18e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        local_18e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_18e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
        local_18e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
        if (local_1878.
            super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_1878.
            super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar51 = 0;
          lVar27 = 0;
          do {
            if ((local_1838.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start ==
                 local_1838.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish) ||
               (local_1838.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_start[lVar27] == uVar51)) {
              std::vector<bool,_std::allocator<bool>_>::push_back(&local_18e8,true);
              uVar51 = uVar51 + 1;
            }
            else {
              std::vector<bool,_std::allocator<bool>_>::push_back(&local_18e8,false);
            }
            lVar27 = lVar27 + 1;
          } while (lVar25 + (ulong)(lVar25 == 0) != lVar27);
        }
        if (psVar19 != psVar48) {
          uVar50 = 0;
          do {
            uVar47 = uVar50 + 0x3f;
            if (-1 < (long)uVar50) {
              uVar47 = uVar50;
            }
            if ((*(ulong *)((long)local_18e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           (ulong)((uVar50 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                           ((long)uVar47 >> 6) * 8 + -8) >> (uVar50 & 0x3f) & 1) == 0) {
              std::
              vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
              ::push_back((vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
                           *)&local_17a8,
                          (value_type *)
                          (local_17a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start +
                          local_1838.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar50] * 2));
            }
            else {
              local_1720._0_8_ =
                   (((psVar48->
                     super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->counts_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start;
              local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
              ._M_start.super__Bit_iterator_base._M_p =
                   (_Bit_type *)
                   (((psVar48->
                     super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->counts_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_finish;
              local_1670 = (undefined1  [8])0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<std::discrete_distribution<int>,std::allocator<std::discrete_distribution<int>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
                        (&local_1668,(discrete_distribution<int> **)local_1670,
                         (allocator<std::discrete_distribution<int>_> *)&local_1810,
                         (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                          *)local_1720,
                         (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                          *)&local_18a0);
              std::
              vector<std::shared_ptr<std::discrete_distribution<int>>,std::allocator<std::shared_ptr<std::discrete_distribution<int>>>>
              ::emplace_back<std::shared_ptr<std::discrete_distribution<int>>>
                        ((vector<std::shared_ptr<std::discrete_distribution<int>>,std::allocator<std::shared_ptr<std::discrete_distribution<int>>>>
                          *)&local_17a8,(shared_ptr<std::discrete_distribution<int>_> *)local_1670);
              if (local_1668._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1668._M_pi);
              }
            }
            uVar50 = uVar50 + 1;
            psVar48 = psVar48 + 1;
          } while (lVar25 + (ulong)(lVar25 == 0) != uVar50);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"initialize covec ...",0x14);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
        covec::Covec<float>::
        Covec<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                  ((Covec<float> *)local_1720,
                   (vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
                    *)&local_17a8,
                   (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                    *)local_13b8,local_17d0,local_17d4,local_17f0,local_17d8,local_17dc,
                   local_1468.enable_chopout,&local_1838);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"start training ...",0x12);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
        local_17f0 = std::chrono::_V2::system_clock::now();
        if (local_1468.num_epochs != 0) {
          uVar50 = local_1468.num_threads + (local_1468.num_threads == 0);
          local_18f8 = 0;
          sVar49 = 0;
          local_1908 = local_17f0;
          local_1818 = uVar50;
          do {
            rVar34 = std::
                     mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                     ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                                   *)local_13b8);
            srand((uint)rVar34);
            pvVar21 = local_1858.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pvVar20 = local_1858.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (((local_1468.shuffle_enabled != false) &&
                (local_1858.
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start !=
                 local_1858.
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)) &&
               (local_1858.
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 1 !=
                local_1858.
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)) {
              lVar25 = 0x18;
              do {
                iVar24 = rand();
                lVar27 = (long)iVar24 % ((lVar25 >> 3) * -0x5555555555555555 + 1);
                if (lVar25 != lVar27 * 0x18) {
                  pvVar35 = pvVar20 + lVar27;
                  puVar10 = *(pointer *)
                             ((long)&(pvVar20->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data._M_end_of_storage + lVar25);
                  puVar2 = (undefined8 *)
                           ((long)&(pvVar20->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_start + lVar25);
                  puVar15 = (pointer)*puVar2;
                  puVar16 = (pointer)puVar2[1];
                  *(pointer *)
                   ((long)&(pvVar20->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start + lVar25) =
                       (pvVar35->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_start;
                  puVar17 = (pvVar35->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_end_of_storage;
                  puVar2 = (undefined8 *)
                           ((long)&(pvVar20->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_finish + lVar25);
                  *puVar2 = (pvVar35->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_finish;
                  puVar2[1] = puVar17;
                  (pvVar35->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start = puVar15;
                  (pvVar35->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_finish = puVar16;
                  (pvVar35->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_end_of_storage = puVar10;
                }
                pvVar35 = (pointer)((long)&pvVar20[1].
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar25);
                lVar25 = lVar25 + 0x18;
              } while (pvVar35 != pvVar21);
            }
            local_17d0 = sVar49;
            if ((long)local_1858.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_1858.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start != 0) {
              uVar47 = ((long)local_1858.
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_1858.
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
              local_17e8 = (pointer)(sVar49 + 1);
              uVar57 = 0;
              do {
                uVar38 = uVar57 + 1000000;
                if (uVar38 <= uVar47) {
                  uVar47 = uVar38;
                }
                uVar36 = (uVar47 - uVar57) / local_1468.num_threads;
                std::vector<std::thread,_std::allocator<std::thread>_>::vector
                          ((vector<std::thread,_std::allocator<std::thread>_> *)local_1670,
                           local_1468.num_threads,(allocator_type *)&local_18a0);
                uVar43 = 1;
                lVar25 = 0;
                do {
                  lVar27 = lVar25 * uVar36;
                  if (uVar43 < local_1468.num_threads) {
                    local_1810 = (anonymous_namespace)::
                                 run_thread<float,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                    ;
                    local_18c0._0_8_ = local_1720;
                    local_1738.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)(local_1858.
                                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar57 + lVar27);
                    local_1788._M_current =
                         local_1858.
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar57 + (lVar25 + 1) * uVar36;
                    local_1790._M_data =
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)local_13b8;
                    std::thread::
                    thread<void(*)(covec::Covec<float>&,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,unsigned_long,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&),std::reference_wrapper<covec::Covec<float>>,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,unsigned_long_const&,std::reference_wrapper<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>,void>
                              ((thread *)&local_18a0,&local_1810,
                               (reference_wrapper<covec::Covec<float>_> *)local_18c0,
                               (__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                *)&local_1738,&local_1788,&local_1780,&local_1790);
                  }
                  else {
                    local_1810 = (anonymous_namespace)::
                                 run_thread<float,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                    ;
                    local_18c0._0_8_ = local_1720;
                    local_1738.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)(local_1858.
                                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar57 + lVar27);
                    local_1788._M_current =
                         local_1858.
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar47;
                    local_1790._M_data =
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)local_13b8;
                    std::thread::
                    thread<void(*)(covec::Covec<float>&,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,unsigned_long,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&),std::reference_wrapper<covec::Covec<float>>,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,unsigned_long_const&,std::reference_wrapper<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>,void>
                              ((thread *)&local_18a0,&local_1810,
                               (reference_wrapper<covec::Covec<float>_> *)local_18c0,
                               (__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                *)&local_1738,&local_1788,&local_1780,&local_1790);
                  }
                  if (*(long *)((long)local_1670 + uVar43 * 8 + -8) != 0) {
                    std::terminate();
                  }
                  *(_Bit_type **)((long)local_1670 + uVar43 * 8 + -8) =
                       local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                  bVar60 = uVar43 != uVar50;
                  uVar43 = uVar43 + 1;
                  uVar53 = local_1818;
                  lVar25 = lVar25 + 1;
                } while (bVar60);
                do {
                  std::thread::join();
                  uVar53 = uVar53 - 1;
                } while (uVar53 != 0);
                local_18f8 = local_18f8 + (uVar47 - uVar57);
                lVar25 = std::chrono::_V2::system_clock::now();
                auVar61._8_4_ = (int)((ulong)local_18f8 >> 0x20);
                auVar61._0_8_ = local_18f8;
                auVar61._12_4_ = 0x45300000;
                dVar63 = auVar61._8_8_ - 1.9342813113834067e+25;
                dVar14 = (dVar63 + ((double)CONCAT44(0x43300000,(int)local_18f8) -
                                   4503599627370496.0)) * 100.0;
                if (999999 < (long)(lVar25 - local_1908)) {
                  auVar13._8_4_ = SUB84(dVar63,0);
                  auVar13._0_8_ = dVar14;
                  auVar13._12_4_ = (int)((ulong)dVar63 >> 0x20);
                  lVar27 = (long)local_1858.
                                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_1858.
                                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\r",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"epoch ",6);
                  lVar25 = std::cout;
                  *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash +
                           *(long *)(std::cout + -0x18)) =
                       *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash +
                                *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x80;
                  *(undefined8 *)(std::__cxx11::string::find + *(long *)(lVar25 + -0x18)) = 3;
                  poVar29 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar29,"/",1);
                  poVar29 = std::ostream::_M_insert<unsigned_long>((ulong)poVar29);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar29,"  ",2);
                  lVar27 = local_1468.num_epochs * -0x5555555555555555 * (lVar27 >> 3);
                  auVar62._8_4_ = (int)((ulong)lVar27 >> 0x20);
                  auVar62._0_8_ = lVar27;
                  auVar62._12_4_ = 0x45300000;
                  lVar25 = *(long *)poVar29;
                  *(uint *)(poVar29 + *(long *)(lVar25 + -0x18) + 0x18) =
                       *(uint *)(poVar29 + *(long *)(lVar25 + -0x18) + 0x18) & 0xffffff4f | 0x20;
                  *(undefined8 *)(poVar29 + *(long *)(lVar25 + -0x18) + 0x10) = 5;
                  *(uint *)(poVar29 + *(long *)(lVar25 + -0x18) + 0x18) =
                       *(uint *)(poVar29 + *(long *)(lVar25 + -0x18) + 0x18) & 0xfffffefb | 4;
                  *(undefined8 *)(poVar29 + *(long *)(lVar25 + -0x18) + 8) = 2;
                  poVar29 = std::ostream::_M_insert<double>
                                      (dVar14 / ((auVar62._8_8_ - 1.9342813113834067e+25) +
                                                ((double)CONCAT44(0x43300000,(int)lVar27) -
                                                4503599627370496.0)));
                  std::__ostream_insert<char,std::char_traits<char>>(poVar29," %",2);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar29,"  ",2);
                  lVar25 = *(long *)poVar29;
                  lVar27 = *(long *)(lVar25 + -0x18);
                  *(uint *)(poVar29 + lVar27 + 0x18) =
                       *(uint *)(poVar29 + lVar27 + 0x18) & 0xffffff4f | 0x20;
                  *(undefined8 *)(poVar29 + *(long *)(lVar25 + -0x18) + 0x10) = 6;
                  poVar29 = std::ostream::_M_insert<unsigned_long>((ulong)poVar29);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar29," words/sec.",0xb);
                  std::ostream::flush();
                  local_1908 = std::chrono::_V2::system_clock::now();
                  uStack_1900 = auVar13._8_8_;
                }
                std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                          ((vector<std::thread,_std::allocator<std::thread>_> *)local_1670);
                uVar47 = ((long)local_1858.
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_1858.
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x5555555555555555;
                uVar57 = uVar38;
              } while (uVar38 < uVar47);
            }
            sVar49 = local_17d0 + 1;
          } while (sVar49 != local_1468.num_epochs);
        }
        lVar25 = std::chrono::_V2::system_clock::now();
        if (999999 < (long)(lVar25 - local_17f0)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\r",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"average: ",9);
          lVar25 = std::cout;
          *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash +
                   *(long *)(std::cout + -0x18)) =
               *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash +
                        *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
          *(undefined8 *)(std::__cxx11::string::find + *(long *)(lVar25 + -0x18)) = 6;
          poVar29 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar29," words/sec.",0xb);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar29 + -0x18) + (char)poVar29);
          std::ostream::put((char)poVar29);
          std::ostream::flush();
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"save ...",8);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
        uVar9 = _memcpy;
        peVar18 = _VTT;
        if (local_1720._8_8_ - local_1720._0_8_ != 0) {
          lVar25 = (long)(local_1720._8_8_ - local_1720._0_8_) >> 4;
          local_1818 = lVar25 + (ulong)(lVar25 == 0);
          uVar50 = 0;
          do {
            pCVar54 = (Covec<float> *)(local_18c0 + 0x10);
            local_1810 = (_func_void_Covec<float>_ptr___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_unsigned_long_mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_ptr
                          *)&local_1800;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1810,local_1778,local_1778 + local_1770);
            std::__cxx11::string::append((char *)&local_1810);
            cVar23 = '\x01';
            if (9 < uVar50) {
              uVar47 = uVar50;
              cVar22 = '\x04';
              do {
                cVar23 = cVar22;
                if (uVar47 < 100) {
                  cVar23 = cVar23 + -2;
                  goto LAB_0010cb22;
                }
                if (uVar47 < 1000) {
                  cVar23 = cVar23 + -1;
                  goto LAB_0010cb22;
                }
                if (uVar47 < 10000) goto LAB_0010cb22;
                bVar60 = 99999 < uVar47;
                uVar47 = uVar47 / 10000;
                cVar22 = cVar23 + '\x04';
              } while (bVar60);
              cVar23 = cVar23 + '\x01';
            }
LAB_0010cb22:
            local_18c0._0_8_ = pCVar54;
            std::__cxx11::string::_M_construct((ulong)local_18c0,cVar23);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      ((char *)local_18c0._0_8_,local_18c0._8_4_,uVar50);
            ppVar46 = (pointer)0xf;
            if (local_1810 !=
                (_func_void_Covec<float>_ptr___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_unsigned_long_mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_ptr
                 *)&local_1800) {
              ppVar46 = (pointer)CONCAT71(uStack_17ff,local_1800);
            }
            ppVar3 = (pointer)(CONCAT44(local_18c0._12_4_,local_18c0._8_4_) + local_1808);
            if (ppVar46 < ppVar3) {
              ppVar46 = (pointer)0xf;
              if ((Covec<float> *)local_18c0._0_8_ != pCVar54) {
                ppVar46 = (pointer)local_18c0._16_8_;
              }
              if (ppVar46 < ppVar3) goto LAB_0010cb95;
              plVar37 = (long *)std::__cxx11::string::replace
                                          ((ulong)local_18c0,0,(char *)0x0,(ulong)local_1810);
            }
            else {
LAB_0010cb95:
              plVar37 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_1810,local_18c0._0_8_);
            }
            local_1670 = (undefined1  [8])local_1660;
            peVar1 = (element_type *)(plVar37 + 2);
            if ((element_type *)*plVar37 == peVar1) {
              local_1660[0]._M_param._M_prob.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (peVar1->_M_param)._M_prob.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              local_1660[0]._M_param._M_prob.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)plVar37[3];
            }
            else {
              local_1660[0]._M_param._M_prob.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (peVar1->_M_param)._M_prob.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              local_1670 = (undefined1  [8])*plVar37;
            }
            local_1668._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar37[1];
            *plVar37 = (long)peVar1;
            plVar37[1] = 0;
            *(undefined1 *)
             &(peVar1->_M_param)._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_start = 0;
            plVar37 = (long *)std::__cxx11::string::append((char *)local_1670);
            local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p =
                 (_Bit_type *)
                 &local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish;
            plVar39 = plVar37 + 2;
            if ((_Bit_iterator *)*plVar37 == (_Bit_iterator *)plVar39) {
              local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
              ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar39;
              local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
              ._M_finish.super__Bit_iterator_base._8_8_ = plVar37[3];
            }
            else {
              local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
              ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar39;
              local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
              ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar37;
            }
            local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._8_8_ = plVar37[1];
            *plVar37 = (long)plVar39;
            plVar37[1] = 0;
            *(undefined1 *)(plVar37 + 2) = 0;
            if (local_1670 != (undefined1  [8])local_1660) {
              operator_delete((void *)local_1670);
            }
            if ((Covec<float> *)local_18c0._0_8_ != pCVar54) {
              operator_delete((void *)local_18c0._0_8_);
            }
            if (local_1810 !=
                (_func_void_Covec<float>_ptr___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_unsigned_long_mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_ptr
                 *)&local_1800) {
              operator_delete(local_1810);
            }
            std::ofstream::ofstream
                      ((ofstream *)local_1670,
                       (char *)local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                       _S_out);
            if (*(int *)((long)&local_1660[0]._M_param._M_prob.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data +
                        (long)((((element_type *)((long)local_1670 + -0x30))->_M_param)._M_cp.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + 2)) != 0) goto LAB_0010d021;
            peVar11 = local_16b8.
                      super__Vector_base<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar50].
                      super___shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            lVar25 = (long)(peVar11->
                           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(peVar11->
                           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
            if (lVar25 != 0) {
              peVar12 = local_1878.
                        super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar50].
                        super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
              lVar25 = (lVar25 >> 3) * -0x5555555555555555;
              lVar27 = 0;
              do {
                pvVar55 = (peVar11->
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar27;
                pbVar59 = (peVar12->code2entries_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                poVar29 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1670,pbVar59[lVar27]._M_dataplus._M_p,
                                     *(size_type *)((long)(pbVar59 + lVar27) + 8));
                std::__ostream_insert<char,std::char_traits<char>>(poVar29,"\t",1);
                std::ostream::_M_insert<double>
                          (*(double *)
                            ((long)(peVar12->counts_).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar27 * 8));
                lVar44 = (long)*(pointer *)
                                ((long)&pvVar55->super__Vector_base<float,_std::allocator<float>_> +
                                8) -
                         *(long *)&pvVar55->super__Vector_base<float,_std::allocator<float>_>;
                if (lVar44 != 0) {
                  lVar44 = lVar44 >> 2;
                  lVar41 = 0;
                  do {
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1670,"\t",1)
                    ;
                    std::ostream::_M_insert<double>
                              ((double)*(float *)(*(long *)&pvVar55->
                                                  super__Vector_base<float,_std::allocator<float>_>
                                                 + lVar41 * 4));
                    lVar41 = lVar41 + 1;
                  } while (lVar44 + (ulong)(lVar44 == 0) != lVar41);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1670,"\n",1);
                lVar27 = lVar27 + 1;
              } while (lVar27 != lVar25 + (ulong)(lVar25 == 0));
            }
            local_1670 = (undefined1  [8])peVar18;
            *(undefined8 *)
             (local_1670 +
             (long)peVar18[-1]._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start) = uVar9;
            std::filebuf::~filebuf((filebuf *)&local_1668);
            std::ios_base::~ios_base(local_1578);
            if ((_Bit_iterator *)
                local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                &local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish) {
              operator_delete(local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != local_1818);
        }
        if (local_1688 != (pointer)0x0) {
          operator_delete(local_1688);
        }
        std::
        vector<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
        ::~vector(&local_16a0);
        std::
        vector<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
        ::~vector(&local_16b8);
        std::
        vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
        ::~vector(&local_16d0);
        if (local_16e8 != (pointer)0x0) {
          operator_delete(local_16e8);
        }
        std::
        vector<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>::
        ~vector((vector<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                 *)local_1720);
        if ((_Bit_iterator *)
            local_18e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p != (_Bit_iterator *)0x0) {
          operator_delete(local_18e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
          local_18e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_18e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_offset = 0;
          local_18e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_18e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset = 0;
          local_18e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage = (_Bit_pointer)0x0;
        }
        std::
        vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
        ::~vector((vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
                   *)&local_17a8);
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::~vector(&local_1858);
        std::
        vector<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
        ::~vector(&local_1878);
        if (local_1838.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
          operator_delete(local_1838.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_1758 != local_1748) {
          operator_delete(local_1758);
        }
        if (local_1778 != local_1768) {
          operator_delete(local_1778);
        }
        if (local_17c8 != local_17b8) {
          operator_delete(local_17c8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1468.share_str._M_dataplus._M_p != &local_1468.share_str.field_2) {
          operator_delete(local_1468.share_str._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1468.output_prefix._M_dataplus._M_p != &local_1468.output_prefix.field_2) {
          operator_delete(local_1468.output_prefix._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1468.input_file._M_dataplus._M_p != &local_1468.input_file.field_2) {
          operator_delete(local_1468.input_file._M_dataplus._M_p);
        }
        return 0;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"empty first line in  input file : ",0x22);
      poVar29 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,local_17c8,local_17c0);
      std::endl<char,std::char_traits<char>>(poVar29);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"cannot read a line from input file : ",0x25);
      poVar29 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,local_17c8,local_17c0);
      std::endl<char,std::char_traits<char>>(poVar29);
    }
  }
  else {
LAB_0010d0b8:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"input file cannot open : ",0x19);
    poVar29 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,local_17c8,local_17c0);
    std::endl<char,std::char_traits<char>>(poVar29);
  }
LAB_0010d00b:
  exit(1);
LAB_0010d021:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"cannot open output_vector_file: ",0x20);
  poVar29 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       (char *)local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                       local_18a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_);
  std::endl<char,std::char_traits<char>>(poVar29);
  goto LAB_0010d00b;
}

Assistant:

int main(int narg, const char** argv)
{
  const auto& config = parse_args(narg, argv);

  const std::size_t dim = config.dim;
  const std::size_t batch_size = config.batch_size;
  const std::size_t num_epochs = config.num_epochs;
  const std::size_t neg_size = config.neg_size;
  const std::size_t num_threads = config.num_threads;
  const Real sigma = config.sigma;
  const Real eta0 = config.eta0;
  const Real eta1 = config.eta1;
  const bool enable_chopout = config.enable_chopout;
  const std::string input_file = config.input_file;
  const std::string output_prefix = config.output_prefix;
  const char sep = config.sep;
  const std::string share_str = config.share_str;
  const std::vector<std::size_t> share = parse_share_str(share_str);
  const std::size_t order = detect_order(input_file, sep);
  const bool shuffle_enabled = config.shuffle_enabled;
  const bool sort_enabled = config.sort_enabled;

  std::cout << "config:" << std::endl;
  std::cout << "  " <<  "dim          : " << dim << std::endl;
  std::cout << "  " <<  "batch_size   : " << batch_size << std::endl;
  std::cout << "  " <<  "num_epochs   : " << num_epochs << std::endl;
  std::cout << "  " <<  "neg_size     : " << neg_size << std::endl;
  std::cout << "  " <<  "num_threads  : " << num_threads << std::endl;  
  std::cout << "  " <<  "sigma        : " << sigma << std::endl;
  std::cout << "  " <<  "eta0         : " << eta0 << std::endl;
  std::cout << "  " <<  "eta1         : " << eta1 << std::endl;
  std::cout << "  " <<  "input_file   : " << input_file << std::endl;
  std::cout << "  " <<  "output_vector_file  : " << output_prefix + ".<#>.tsv" << std::endl;
  std::cout << "  " <<  "sep          : " << "\"" << sep << "\"" << std::endl;
  
  std::cout << "  " <<  "share        : ";
  for(int i = 0; i < share.size(); ++i){
    if(i > 0){
      std::cout << ",";
    }
    std::cout << share[i];
  }
  std::cout << std::endl;
  
  std::cout << "  " <<  "order        : " << order << std::endl;
  std::cout << "  " <<  "shuffle      : " << std::boolalpha << shuffle_enabled << std::endl;
  std::cout << "  " <<  "sort         : " << std::boolalpha << sort_enabled << std::endl;

  std::vector<std::shared_ptr<CodeBook> > codebooks;
  std::vector<std::vector<std::size_t> > data;
  std::mt19937 gen(0);
  std::cout << "load " << input_file << " ..." << std::endl;;
  load(codebooks, data, input_file, order, sep, sort_enabled, share);
  std::cout << "data size: " << data.size() << std::endl;
  std::cout << "codebook sizes:" << std::endl;
  for(std::size_t i=0; i<order; ++i){
    std::cout << "  " << i << ": " << codebooks[i]->size() << std::endl;
  }

  std::cout << "creat distributions ..." << std::endl;
  std::vector<std::shared_ptr<std::discrete_distribution<int> > > probs;

  std::vector<bool> first_of_sharings;
  std::size_t counter=0;
  for(std::size_t i=0; i < codebooks.size(); ++i){
    if(share.empty() || share[i] == counter){
      first_of_sharings.push_back(true);
      ++counter;      
    }else{
      first_of_sharings.push_back(false);
    }
  }
  
  for(std::size_t i=0; i < codebooks.size(); ++i){
    if(!first_of_sharings[i]){
      probs.push_back(probs[share[i]]);
    }else{
      probs.push_back( std::make_shared<std::discrete_distribution<int> >
                       (codebooks[i]->counts().begin(), codebooks[i]->counts().end())
                       );
    }
  }
  
  std::cout << "initialize covec ..." << std::endl;
  Covec<Real> cv(probs, gen, dim, sigma, neg_size, eta0, eta1, enable_chopout, share);

  std::cout << "start training ..." << std::endl;
  std::size_t cum_count = 0, every_count = 1000000;
  auto tick = std::chrono::system_clock::now();
  auto start = tick;
  for(std::size_t epoch=0; epoch<num_epochs; ++epoch){
    std::srand(gen());
    if(shuffle_enabled){ std::random_shuffle(data.begin(), data.end()); }

    for(std::size_t m = 0; m < data.size(); m += every_count){

      std::size_t count = std::min(m + every_count, data.size()) - m; // the number of data in this round
      
      std::size_t step = count / num_threads; // data / thread

      // multi thread update
      std::vector<std::thread> threads(num_threads);
      for(std::size_t n=0; n < num_threads; ++n){
        if(n + 1 < num_threads){
          threads[n] = std::thread(&::run_thread<Real,
                                   std::vector<std::vector<std::size_t> >::const_iterator,
                                   std::mt19937
                                   >,
                                   std::ref(cv),
                                   data.cbegin() + m + n * step,
                                   data.cbegin() + m + (n+1) * step,
                                   batch_size,
                                   std::ref(gen));
          assert( m + (n+1) * step <= data.size() );
        }else{
          threads[n] = std::thread(&::run_thread<Real,
                                   std::vector<std::vector<std::size_t> >::const_iterator,
                                   std::mt19937
                                   >,
                                   std::ref(cv),
                                   data.cbegin() + m + n * step,
                                   data.cbegin() + m + count,
                                   batch_size,
                                   std::ref(gen));
          assert( std::min(m + every_count, data.size()) <= data.size() );	  
        }
      }
      for(std::size_t n=0; n < num_threads; ++n){
        threads[n].join();
      }
      
      cum_count += count;
      
      // report
      auto tack = std::chrono::system_clock::now();
      auto millisec = std::chrono::duration_cast<std::chrono::milliseconds>(tack - tick).count();
      double percent = (cum_count * 100.0) / (data.size() * num_epochs);
      if(millisec>0){
        std::size_t words_per_sec = (millisec != 0)? (1000*count) / millisec : std::numeric_limits<std::size_t>::max();
        std::cout << "\r"
                  << "epoch " << std::right << std::setw(3) << epoch+1 << "/" << num_epochs
                  << "  " << std::left << std::setw(5) << std::fixed << std::setprecision(2) << percent << " %"
                  << "  " << std::left << std::setw(6) << words_per_sec << " words/sec."
                  << std::flush;
        tick = std::chrono::system_clock::now();
      }
    }
  }

  auto tack = std::chrono::system_clock::now();
  auto millisec = std::chrono::duration_cast<std::chrono::milliseconds>(tack - start).count();
  if(millisec > 0){
    std::size_t words_per_sec = (1000 * data.size() * num_epochs) / millisec;
    std::cout << "\r" << "average: " 
              << std::left << std::setw(6)
              << words_per_sec << " words/sec." << std::endl;
  }
  std::cout << std::endl;
  std::cout << "save ..." << std::endl;
  save(output_prefix, cv, codebooks);

  return 0;
}